

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * Kvm::stringToSymbol(Kvm *vm,Value *args)

{
  Value *pVVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,(char *)args[1]._vptr_Value[3],&local_31);
  pVVar1 = makeSymbol(vm,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pVVar1;
}

Assistant:

const Value* Kvm::stringToSymbol(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    return vm->makeSymbol(s->value_);
}